

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControl::moveCursor(QWidgetTextControl *this,MoveOperation op,MoveMode mode)

{
  long lVar1;
  QWidgetTextControlPrivate *this_00;
  char cVar2;
  long in_FS_OFFSET;
  QTextCursor oldSelection;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  _oldSelection = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor(&oldSelection,&this_00->cursor);
  cVar2 = QTextCursor::movePosition((MoveOperation)&this_00->cursor,op,mode);
  QWidgetTextControlPrivate::_q_updateCurrentCharFormatAndSelection(this_00);
  (**(code **)(*(long *)this + 0x60))(this);
  QWidgetTextControlPrivate::repaintOldAndNewSelection(this_00,&oldSelection);
  if (cVar2 != '\0') {
    cursorPositionChanged(this);
  }
  QTextCursor::~QTextCursor(&oldSelection);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::moveCursor(QTextCursor::MoveOperation op, QTextCursor::MoveMode mode)
{
    Q_D(QWidgetTextControl);
    const QTextCursor oldSelection = d->cursor;
    const bool moved = d->cursor.movePosition(op, mode);
    d->_q_updateCurrentCharFormatAndSelection();
    ensureCursorVisible();
    d->repaintOldAndNewSelection(oldSelection);
    if (moved)
        emit cursorPositionChanged();
}